

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::updateSizes(QFormLayoutPrivate *this)

{
  QFormLayoutItem *pQVar1;
  QFormLayoutItem *pQVar2;
  bool bVar3;
  RowWrapPolicy RVar4;
  int iVar5;
  Int IVar6;
  Int IVar7;
  int iVar8;
  QWidget *pQVar9;
  QFormLayoutItem **ppQVar10;
  int *piVar11;
  QFormLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar12;
  QFormLayoutItem *fldtop_1;
  QFormLayoutItem *lbltop_1;
  QFormLayoutItem *fldtop;
  QFormLayoutItem *lbltop;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  int i;
  int userHSpacing;
  int userVSpacing;
  QStyle *style;
  QWidget *parent;
  QFormLayoutItem *prevFld;
  QFormLayoutItem *prevLbl;
  bool expandV;
  bool expandH;
  int rr;
  bool dontWrapRows;
  bool wrapAllRows;
  RowWrapPolicy wrapPolicy;
  QFormLayout *q;
  int fldspacing_1;
  int lblspacing_1;
  int fldspacing;
  int lblspacing;
  ControlTypes fldtoptypes_1;
  ControlTypes lbltoptypes_1;
  ControlTypes fldtoptypes;
  ControlTypes lbltoptypes;
  ControlTypes fldtypes;
  ControlTypes lbltypes;
  Orientations o_1;
  Orientations o;
  int maxShIfldWidth;
  int maxShFldWidth;
  int maxShLblWidth;
  int maxMinIfldWidth;
  int maxMinFldWidth;
  int maxMinLblWidth;
  int in_stack_fffffffffffffe48;
  Orientation in_stack_fffffffffffffe4c;
  FixedColumnMatrix<QFormLayoutItem_*,_2> *in_stack_fffffffffffffe50;
  QFormLayoutItem *in_stack_fffffffffffffe58;
  QFormLayoutItem *in_stack_fffffffffffffe60;
  QFormLayoutItem *pQVar13;
  QFormLayoutItem *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  Int in_stack_fffffffffffffe74;
  QFormLayoutItem *in_stack_fffffffffffffe78;
  Orientation OVar14;
  undefined4 in_stack_fffffffffffffe80;
  Int in_stack_fffffffffffffe84;
  QFlagsStorage<QSizePolicy::ControlType> in_stack_fffffffffffffe98;
  Int IVar15;
  QFlagsStorage<QSizePolicy::ControlType> controls1;
  FixedColumnMatrix<QFormLayoutItem_*,_2> *local_160;
  int local_11c;
  QFormLayoutItem *local_100;
  QFormLayoutItem *local_f8;
  byte local_ee;
  byte local_ed;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac [3];
  Int local_a0;
  Int local_9c;
  Int local_98;
  Int local_94;
  int local_90;
  Int local_8c;
  Int local_88;
  int local_84;
  Int local_80;
  Int local_7c;
  Int local_78;
  Int local_74;
  int local_70;
  Int local_6c;
  Int local_68;
  int local_64;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> local_60;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> local_5c;
  Int local_58;
  Int local_54;
  Int local_50;
  Int local_4c;
  QFlagsStorage<QSizePolicy::ControlType> local_48;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> local_44;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> local_40;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> local_3c;
  QFlagsStorageHelper<Qt::Orientation,_4> local_38;
  QFlagsStorageHelper<Qt::Orientation,_4> local_34;
  QFlagsStorageHelper<Qt::Orientation,_4> local_30;
  QFlagsStorageHelper<Qt::Orientation,_4> local_2c;
  QFlagsStorageHelper<Qt::Orientation,_4> local_28;
  QFlagsStorageHelper<Qt::Orientation,_4> local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if ((*(uint *)&in_RDI->field_0xb0 >> 0x14 & 3) != 0) {
    RVar4 = QFormLayout::rowWrapPolicy
                      ((QFormLayout *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
    ;
    bVar12 = RVar4 != WrapAllRows;
    iVar5 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b21c8);
    *(uint *)&in_RDI->field_0xb0 = *(uint *)&in_RDI->field_0xb0 & 0xfffcffff;
    local_ed = 0;
    local_ee = 0;
    local_f8 = (QFormLayoutItem *)0x0;
    local_100 = (QFormLayoutItem *)0x0;
    pQVar9 = QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe60);
    if (pQVar9 == (QWidget *)0x0) {
      local_160 = (FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x0;
    }
    else {
      local_160 = (FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                  QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    IVar6 = QFormLayout::verticalSpacing((QFormLayout *)in_stack_fffffffffffffe58);
    if (bVar12) {
      IVar15 = QFormLayout::horizontalSpacing((QFormLayout *)in_stack_fffffffffffffe58);
    }
    else {
      IVar15 = 0;
    }
    local_c = 0;
    local_10 = 0;
    local_14 = 0;
    local_18 = 0;
    local_1c = 0;
    local_20 = 0;
    controls1.i = IVar15;
    for (local_11c = 0; local_11c < iVar5; local_11c = local_11c + 1) {
      ppQVar10 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                            in_stack_fffffffffffffe48);
      pQVar1 = *ppQVar10;
      ppQVar10 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                            in_stack_fffffffffffffe48);
      pQVar2 = *ppQVar10;
      if ((pQVar1 != (QFormLayoutItem *)0x0) || (pQVar2 != (QFormLayoutItem *)0x0)) {
        if (pQVar1 != (QFormLayoutItem *)0x0) {
          in_stack_fffffffffffffe98.i = IVar6;
          QFormLayout::fieldGrowthPolicy
                    ((QFormLayout *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          updateFormLayoutItem
                    (in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (FieldGrowthPolicy)in_stack_fffffffffffffe50,
                     SUB41(in_stack_fffffffffffffe4c >> 0x18,0));
          if ((pQVar1->isHfw & 1U) != 0) {
            *(uint *)&in_RDI->field_0xb0 = *(uint *)&in_RDI->field_0xb0 & 0xfffcffff | 0x10000;
          }
          local_24.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)0xaaaaaaaa;
          local_24.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFormLayoutItem::expandingDirections
                         ((QFormLayoutItem *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_28.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe4c);
          IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
          if (IVar7 != 0) {
            local_ee = 1;
          }
          local_2c.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe4c);
          IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
          if (IVar7 != 0) {
            local_ed = 1;
          }
        }
        if (pQVar2 != (QFormLayoutItem *)0x0) {
          in_stack_fffffffffffffe78 = pQVar2;
          in_stack_fffffffffffffe84 = IVar6;
          QFormLayout::fieldGrowthPolicy
                    ((QFormLayout *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          updateFormLayoutItem
                    (in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (FieldGrowthPolicy)in_stack_fffffffffffffe50,
                     SUB41(in_stack_fffffffffffffe4c >> 0x18,0));
          in_stack_fffffffffffffe74 = IVar15;
          if ((pQVar1 == (QFormLayoutItem *)0x0) && ((pQVar2->fullRow & 1U) != 0)) {
            in_stack_fffffffffffffe74 = 0;
          }
          pQVar2->sbsHSpace = in_stack_fffffffffffffe74;
          if ((pQVar2->isHfw & 1U) != 0) {
            *(uint *)&in_RDI->field_0xb0 = *(uint *)&in_RDI->field_0xb0 & 0xfffcffff | 0x10000;
          }
          local_30.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)0xaaaaaaaa;
          local_30.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFormLayoutItem::expandingDirections
                         ((QFormLayoutItem *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_34.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe4c);
          IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
          if (IVar7 != 0) {
            local_ee = 1;
          }
          local_38.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe4c);
          IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
          if (IVar7 != 0) {
            local_ed = 1;
          }
        }
        if ((((int)IVar15 < 0) || ((int)IVar6 < 0)) &&
           (local_160 != (FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x0)) {
          local_3c.super_QFlagsStorage<QSizePolicy::ControlType>.i =
               (QFlagsStorage<QSizePolicy::ControlType>)0xaaaaaaaa;
          if (pQVar1 == (QFormLayoutItem *)0x0) {
            QFlags<QSizePolicy::ControlType>::QFlags
                      ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c);
          }
          else {
            local_3c.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                 (QFlagsStorage<QSizePolicy::ControlType>)
                 QFormLayoutItem::controlTypes
                           ((QFormLayoutItem *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          }
          local_40.super_QFlagsStorage<QSizePolicy::ControlType>.i =
               (QFlagsStorage<QSizePolicy::ControlType>)0xaaaaaaaa;
          if (pQVar2 == (QFormLayoutItem *)0x0) {
            QFlags<QSizePolicy::ControlType>::QFlags
                      ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c);
          }
          else {
            local_40.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                 (QFlagsStorage<QSizePolicy::ControlType>)
                 QFormLayoutItem::controlTypes
                           ((QFormLayoutItem *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          }
          if ((int)IVar6 < 0) {
            if (bVar12) {
              in_stack_fffffffffffffe58 = local_100;
              if (local_f8 != (QFormLayoutItem *)0x0) {
                in_stack_fffffffffffffe58 = local_f8;
              }
              local_5c.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                   (QFlagsStorage<QSizePolicy::ControlType>)0xaaaaaaaa;
              if (in_stack_fffffffffffffe58 == (QFormLayoutItem *)0x0) {
                QFlags<QSizePolicy::ControlType>::QFlags
                          ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe4c);
              }
              else {
                local_5c.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                     (QFlagsStorage<QSizePolicy::ControlType>)
                     QFormLayoutItem::controlTypes
                               ((QFormLayoutItem *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              }
              local_60.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                   (QFlagsStorage<QSizePolicy::ControlType>)0xaaaaaaaa;
              if (local_100 == (QFormLayoutItem *)0x0) {
                QFlags<QSizePolicy::ControlType>::QFlags
                          ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe4c);
              }
              else {
                local_60.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                     (QFlagsStorage<QSizePolicy::ControlType>)
                     QFormLayoutItem::controlTypes
                               ((QFormLayoutItem *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              }
              if ((pQVar1 != (QFormLayoutItem *)0x0) &&
                 (bVar3 = QFormLayoutItem::isHidden(in_stack_fffffffffffffe60), !bVar3)) {
                OVar14 = (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20);
                if (pQVar2 == (QFormLayoutItem *)0x0) {
                  local_68 = (Int)local_5c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_6c = (Int)local_3c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_64 = QStyle::combinedLayoutSpacing
                                       ((QStyle *)
                                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),(ControlTypes)controls1.i,
                                        (ControlTypes)in_stack_fffffffffffffe98.i,OVar14,
                                        (QStyleOption *)
                                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),(QWidget *)in_stack_fffffffffffffe68);
                  local_74 = (Int)local_60.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_78 = (Int)local_3c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_70 = QStyle::combinedLayoutSpacing
                                       ((QStyle *)
                                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),(ControlTypes)controls1.i,
                                        (ControlTypes)in_stack_fffffffffffffe98.i,
                                        (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                                        (QStyleOption *)
                                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),(QWidget *)in_stack_fffffffffffffe68);
                  piVar11 = qMax<int>(&local_64,&local_70);
                  pQVar1->vSpace = *piVar11;
                }
                else {
                  local_7c = (Int)local_5c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_80 = (Int)local_3c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  iVar8 = QStyle::combinedLayoutSpacing
                                    ((QStyle *)
                                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                     (ControlTypes)controls1.i,
                                     (ControlTypes)in_stack_fffffffffffffe98.i,OVar14,
                                     (QStyleOption *)
                                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                     (QWidget *)in_stack_fffffffffffffe68);
                  pQVar1->vSpace = iVar8;
                }
              }
              if ((pQVar2 != (QFormLayoutItem *)0x0) &&
                 (bVar3 = QFormLayoutItem::isHidden(in_stack_fffffffffffffe60), !bVar3)) {
                OVar14 = (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20);
                if (pQVar1 == (QFormLayoutItem *)0x0) {
                  local_88 = (Int)local_5c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_8c = (Int)local_40.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_84 = QStyle::combinedLayoutSpacing
                                       ((QStyle *)
                                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),(ControlTypes)controls1.i,
                                        (ControlTypes)in_stack_fffffffffffffe98.i,OVar14,
                                        (QStyleOption *)
                                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),(QWidget *)in_stack_fffffffffffffe68);
                  local_94 = (Int)local_60.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_98 = (Int)local_40.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_90 = QStyle::combinedLayoutSpacing
                                       ((QStyle *)
                                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),(ControlTypes)controls1.i,
                                        (ControlTypes)in_stack_fffffffffffffe98.i,
                                        (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                                        (QStyleOption *)
                                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),(QWidget *)in_stack_fffffffffffffe68);
                  piVar11 = qMax<int>(&local_84,&local_90);
                  pQVar2->vSpace = *piVar11;
                }
                else {
                  local_9c = (Int)local_60.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  local_a0 = (Int)local_40.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                  iVar8 = QStyle::combinedLayoutSpacing
                                    ((QStyle *)
                                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                     (ControlTypes)controls1.i,
                                     (ControlTypes)in_stack_fffffffffffffe98.i,OVar14,
                                     (QStyleOption *)
                                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                     (QWidget *)in_stack_fffffffffffffe68);
                  pQVar2->vSpace = iVar8;
                }
              }
            }
            else {
              if (local_100 != (QFormLayoutItem *)0x0) {
                local_f8 = local_100;
              }
              pQVar13 = local_f8;
              if (pQVar1 != (QFormLayoutItem *)0x0) {
                pQVar13 = pQVar1;
              }
              local_44.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                   (QFlagsStorage<QSizePolicy::ControlType>)0xaaaaaaaa;
              in_stack_fffffffffffffe60 = pQVar13;
              in_stack_fffffffffffffe68 = local_f8;
              if (local_f8 == (QFormLayoutItem *)0x0) {
                QFlags<QSizePolicy::ControlType>::QFlags
                          ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe4c);
              }
              else {
                local_44.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                     (QFlagsStorage<QSizePolicy::ControlType>)
                     QFormLayoutItem::controlTypes
                               ((QFormLayoutItem *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              }
              local_48.i = 0xaaaaaaaa;
              if (pQVar13 == (QFormLayoutItem *)0x0) {
                QFlags<QSizePolicy::ControlType>::QFlags
                          ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe4c);
              }
              else {
                local_48.i = (Int)QFormLayoutItem::controlTypes
                                            ((QFormLayoutItem *)
                                             CONCAT44(in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe48));
              }
              if ((pQVar1 != (QFormLayoutItem *)0x0) && (local_f8 != (QFormLayoutItem *)0x0)) {
                local_4c = (Int)local_44.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                local_50 = (Int)local_3c.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                iVar8 = QStyle::combinedLayoutSpacing
                                  ((QStyle *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                   (ControlTypes)controls1.i,
                                   (ControlTypes)in_stack_fffffffffffffe98.i,
                                   (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                                   (QStyleOption *)
                                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                   (QWidget *)in_stack_fffffffffffffe68);
                pQVar1->vSpace = iVar8;
              }
              if ((pQVar2 != (QFormLayoutItem *)0x0) && (pQVar13 != (QFormLayoutItem *)0x0)) {
                local_54 = local_48.i;
                local_58 = (Int)local_40.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                iVar8 = QStyle::combinedLayoutSpacing
                                  ((QStyle *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                   (ControlTypes)controls1.i,
                                   (ControlTypes)in_stack_fffffffffffffe98.i,
                                   (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                                   (QStyleOption *)
                                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                   (QWidget *)in_stack_fffffffffffffe68);
                pQVar2->vSpace = iVar8;
              }
            }
          }
          if (((((int)IVar15 < 0) && (bVar12)) &&
              ((pQVar1 != (QFormLayoutItem *)0x0 || ((pQVar2->fullRow & 1U) == 0)))) &&
             (pQVar2 != (QFormLayoutItem *)0x0)) {
            in_stack_fffffffffffffe50 = local_160;
            QFlags<QSizePolicy::ControlType>::QFlags
                      ((QFlags<QSizePolicy::ControlType> *)local_160,in_stack_fffffffffffffe4c);
            QFlags<QSizePolicy::ControlType>::QFlags
                      ((QFlags<QSizePolicy::ControlType> *)in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c);
            iVar8 = QStyle::combinedLayoutSpacing
                              ((QStyle *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               (ControlTypes)controls1.i,(ControlTypes)in_stack_fffffffffffffe98.i,
                               (Orientation)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                               (QStyleOption *)
                               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                               (QWidget *)in_stack_fffffffffffffe68);
            pQVar2->sbsHSpace = iVar8;
          }
        }
        if (pQVar1 != (QFormLayoutItem *)0x0) {
          local_ac[0] = QSize::width((QSize *)0x4b2c5b);
          piVar11 = qMax<int>(&local_c,local_ac);
          local_c = *piVar11;
          local_b0 = QSize::width((QSize *)0x4b2c91);
          piVar11 = qMax<int>(&local_18,&local_b0);
          local_18 = *piVar11;
        }
        local_100 = pQVar2;
        local_f8 = pQVar1;
        if (pQVar2 != (QFormLayoutItem *)0x0) {
          if ((pQVar2->fullRow & 1U) == 0) {
            local_bc = QSize::width((QSize *)0x4b2d55);
            local_bc = local_bc + pQVar2->sbsHSpace;
            piVar11 = qMax<int>(&local_10,&local_bc);
            local_10 = *piVar11;
            local_c0 = QSize::width((QSize *)0x4b2d96);
            local_c0 = local_c0 + pQVar2->sbsHSpace;
            piVar11 = qMax<int>(&local_1c,&local_c0);
            local_1c = *piVar11;
          }
          else {
            local_b4 = QSize::width((QSize *)0x4b2ce4);
            piVar11 = qMax<int>(&local_14,&local_b4);
            local_14 = *piVar11;
            local_b8 = QSize::width((QSize *)0x4b2d1a);
            piVar11 = qMax<int>(&local_20,&local_b8);
            local_20 = *piVar11;
          }
        }
      }
    }
    if (bVar12) {
      if (RVar4 == DontWrapRows) {
        local_c4 = local_18 + local_1c;
        piVar11 = qMax<int>(&local_c4,&local_20);
        in_RDI->sh_width = *piVar11;
        local_c8 = local_c + local_10;
        piVar11 = qMax<int>(&local_c8,&local_14);
        in_RDI->min_width = *piVar11;
        in_RDI->thresh_width = 0xffffff;
      }
      else {
        local_cc = local_18 + local_1c;
        piVar11 = qMax<int>(&local_cc,&local_20);
        in_RDI->sh_width = *piVar11;
        piVar11 = qMax<int>(&local_14,&local_10);
        piVar11 = qMax<int>(&local_c,piVar11);
        in_RDI->min_width = *piVar11;
        in_RDI->thresh_width = local_18 + local_10;
      }
    }
    else {
      piVar11 = qMax<int>(&local_20,&local_1c);
      piVar11 = qMax<int>(&local_18,piVar11);
      in_RDI->sh_width = *piVar11;
      piVar11 = qMax<int>(&local_14,&local_10);
      piVar11 = qMax<int>(&local_c,piVar11);
      in_RDI->min_width = *piVar11;
      in_RDI->thresh_width = 0;
    }
    *(uint *)&in_RDI->field_0xb0 =
         *(uint *)&in_RDI->field_0xb0 & 0xffbfffff | (uint)local_ee << 0x16;
    *(uint *)&in_RDI->field_0xb0 =
         *(uint *)&in_RDI->field_0xb0 & 0xff7fffff | (uint)local_ed << 0x17;
  }
  in_RDI->field_0xb2 = in_RDI->field_0xb2 & 0xcf;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayoutPrivate::updateSizes()
{
    Q_Q(QFormLayout);

    if (sizesDirty) {
        QFormLayout::RowWrapPolicy wrapPolicy = q->rowWrapPolicy();
        bool wrapAllRows = (wrapPolicy == QFormLayout::WrapAllRows);
        bool dontWrapRows = (wrapPolicy == QFormLayout::DontWrapRows);
        int rr = m_matrix.rowCount();

        has_hfw = false;

        // If any control can expand, so can this layout
        // Wrapping doesn't affect expansion, though, just the minsize
        bool expandH = false;
        bool expandV = false;

        QFormLayoutItem *prevLbl = nullptr;
        QFormLayoutItem *prevFld = nullptr;

        QWidget *parent = q->parentWidget();
        QStyle *style = parent ? parent->style() : nullptr;

        int userVSpacing = q->verticalSpacing();
        int userHSpacing = wrapAllRows ? 0 : q->horizontalSpacing();

        int maxMinLblWidth = 0;
        int maxMinFldWidth = 0; // field with label
        int maxMinIfldWidth = 0; // independent field

        int maxShLblWidth = 0;
        int maxShFldWidth = 0;
        int maxShIfldWidth = 0;

        for (int i = 0; i < rr; ++i) {
            QFormLayoutItem *label = m_matrix(i, 0);
            QFormLayoutItem *field = m_matrix(i, 1);

            // Skip empty rows
            if (!label && !field)
                continue;

            if (label) {
                updateFormLayoutItem(label, userVSpacing, q->fieldGrowthPolicy(), false);
                if (label->isHfw)
                    has_hfw = true;
                Qt::Orientations o = label->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }
            if (field) {
                updateFormLayoutItem(field, userVSpacing, q->fieldGrowthPolicy(), !label && field->fullRow);
                field->sbsHSpace = (!label && field->fullRow) ? 0 : userHSpacing;
                if (field->isHfw)
                    has_hfw = true;

                Qt::Orientations o = field->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }

            // See if we need to calculate default spacings
            if ((userHSpacing < 0 || userVSpacing < 0) && style) {
                QSizePolicy::ControlTypes lbltypes =
                    QSizePolicy::ControlTypes(label ? label->controlTypes() : QSizePolicy::DefaultType);
                QSizePolicy::ControlTypes fldtypes =
                    QSizePolicy::ControlTypes(field ? field->controlTypes() : QSizePolicy::DefaultType);

                // VSpacing
                if (userVSpacing < 0) {
                    if (wrapAllRows) {
                        // label spacing is to a previous item
                        QFormLayoutItem *lbltop = prevFld ? prevFld : prevLbl;
                        // field spacing is to the label (or a previous item)
                        QFormLayoutItem *fldtop = label ? label : lbltop;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);
                        if (label && lbltop)
                            label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                        if (field && fldtop)
                            field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                    } else {
                        // Side by side..  we have to also consider the spacings to empty cells, which can strangely be more than
                        // non empty cells..
                        QFormLayoutItem *lbltop = prevLbl ? prevLbl : prevFld;
                        QFormLayoutItem *fldtop = prevFld;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);

                        // To be compatible to QGridLayout, we have to compare solitary labels & fields with both predecessors
                        if (label && !label->isHidden()) {
                            if (!field) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                label->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                            }
                        }

                        if (field && !field->isHidden()) {
                            // check spacing against both the previous label and field
                            if (!label) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                field->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                            }
                        }
                    }
                }

                // HSpacing
                // hard-coded the left and right control types so that all the rows have the same
                // inter-column spacing (otherwise the right column isn't always left aligned)
                if (userHSpacing < 0 && !wrapAllRows && (label || !field->fullRow) && field)
                    field->sbsHSpace = style->combinedLayoutSpacing(QSizePolicy::Label, QSizePolicy::LineEdit, Qt::Horizontal, nullptr, parent);
            }

            // Now update our min/sizehint widths
            // We choose to put the spacing in the field side in sbs, so
            // the right edge of the labels will align, but fields may
            // be a little ragged.. since different controls may have
            // different appearances, a slight raggedness in the left
            // edges of fields can be tolerated.
            // (Note - field->sbsHSpace is 0 for WrapAllRows mode)
            if (label) {
                maxMinLblWidth = qMax(maxMinLblWidth, label->minSize.width());
                maxShLblWidth = qMax(maxShLblWidth, label->sizeHint.width());
            }
            if (field) {
                if (field->fullRow) {
                    maxMinIfldWidth = qMax(maxMinIfldWidth, field->minSize.width());
                    maxShIfldWidth = qMax(maxShIfldWidth, field->sizeHint.width());
                } else {
                    maxMinFldWidth = qMax(maxMinFldWidth, field->minSize.width() + field->sbsHSpace);
                    maxShFldWidth = qMax(maxShFldWidth, field->sizeHint.width() + field->sbsHSpace);
                }
            }

            prevLbl = label;
            prevFld = field;
        }

        // Now, finally update the min/sizeHint widths
        if (wrapAllRows) {
            sh_width = qMax(maxShLblWidth, qMax(maxShIfldWidth, maxShFldWidth));
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // in two line, we don't care as much about the threshold width
            thresh_width = 0;
        } else if (dontWrapRows) {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            min_width = qMax(maxMinLblWidth + maxMinFldWidth, maxMinIfldWidth);
            thresh_width = QWIDGETSIZE_MAX;
        } else {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            // min width needs to be the min when everything is wrapped,
            // otherwise we'll never get set with a width that causes wrapping
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // We split a pair at label sh + field min (### for now..)
            thresh_width = maxShLblWidth + maxMinFldWidth;
        }

        // Update the expansions
        expandVertical = expandV;
        expandHorizontal = expandH;
    }
    sizesDirty = false;
}